

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O3

void __thiscall OpenMD::MoleculeStamp::MoleculeStamp(MoleculeStamp *this)

{
  _Rb_tree_header *p_Var1;
  ParamMap *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ParameterBase *local_40;
  ParameterBase *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__MoleculeStamp_00302618;
  local_38 = &(this->Name).super_ParameterBase;
  (this->Name).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Name).super_ParameterBase.keyword_.field_2;
  (this->Name).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Name).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Name).super_ParameterBase.optional_ = false;
  (this->Name).super_ParameterBase.defaultValue_ = false;
  (this->Name).super_ParameterBase.empty_ = true;
  (this->Name).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_002ff390;
  (this->Name).data_._M_dataplus._M_p = (pointer)&(this->Name).data_.field_2;
  (this->Name).data_._M_string_length = 0;
  (this->Name).data_.field_2._M_local_buf[0] = '\0';
  local_40 = &(this->ConstrainTotalCharge).super_ParameterBase;
  local_48 = &(this->ConstrainTotalCharge).super_ParameterBase.keyword_.field_2;
  (this->ConstrainTotalCharge).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_48;
  (this->ConstrainTotalCharge).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConstrainTotalCharge).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConstrainTotalCharge).super_ParameterBase.optional_ = false;
  (this->ConstrainTotalCharge).super_ParameterBase.defaultValue_ = false;
  (this->ConstrainTotalCharge).super_ParameterBase.empty_ = true;
  (this->ConstrainTotalCharge).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002ffc20;
  memset(&this->atomStamps_,0,0x10c);
  this->ident_ = -1;
  paVar2 = &local_90.first.field_2;
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"name","");
  std::__cxx11::string::_M_assign((string *)&(this->Name).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"name","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_68 == &local_58) {
    local_90.first.field_2._8_8_ = local_58._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_68;
  }
  local_90.first.field_2._M_allocated_capacity._1_7_ = local_58._M_allocated_capacity._1_7_;
  local_90.first.field_2._M_local_buf[0] = local_58._M_local_buf[0];
  local_90.first._M_string_length = local_60;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_90.second = local_38;
  local_68 = &local_58;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0])
                             + 1);
  }
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"constrainTotalCharge","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->ConstrainTotalCharge).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->ConstrainTotalCharge).super_ParameterBase.optional_ = true;
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"constrainTotalCharge","");
  if (local_68 == &local_58) {
    local_90.first.field_2._8_8_ = local_58._8_8_;
    local_90.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_90.first._M_dataplus._M_p = (pointer)local_68;
  }
  local_90.first.field_2._M_allocated_capacity._1_7_ = local_58._M_allocated_capacity._1_7_;
  local_90.first.field_2._M_local_buf[0] = local_58._M_local_buf[0];
  local_90.first._M_string_length = local_60;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_90.second = local_40;
  local_68 = &local_58;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0])
                             + 1);
  }
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"nAtoms","");
  this_01 = &(this->super_DataHolder).deprecatedKeywords_;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_90.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"nBonds","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_90.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"nBends","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_90.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"nTorsions","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_90.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"nInversions","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_90.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"nRigidBodies","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_90.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_90.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"nCutoffGroups","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_90.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

MoleculeStamp::MoleculeStamp() : nintegrable_(0), ident_ {-1} {
    DefineParameter(Name, "name");
    DefineOptionalParameter(ConstrainTotalCharge, "constrainTotalCharge");

    deprecatedKeywords_.insert("nAtoms");
    deprecatedKeywords_.insert("nBonds");
    deprecatedKeywords_.insert("nBends");
    deprecatedKeywords_.insert("nTorsions");
    deprecatedKeywords_.insert("nInversions");
    deprecatedKeywords_.insert("nRigidBodies");
    deprecatedKeywords_.insert("nCutoffGroups");
  }